

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::StrictEqualEmptyString(Var aLeft)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  undefined4 *puVar4;
  JavascriptString *local_30;
  JavascriptString *string;
  Var aLeft_local;
  
  bVar2 = VarIs<Js::JavascriptString>(aLeft);
  if (bVar2) {
    local_30 = UnsafeVarTo<Js::JavascriptString>(aLeft);
  }
  else {
    local_30 = (JavascriptString *)0x0;
  }
  if (local_30 == (JavascriptString *)0x0) {
    aLeft_local._4_4_ = 0;
  }
  else {
    if (local_30 == (JavascriptString *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x340,"(string)","string");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    cVar3 = JavascriptString::GetLength(local_30);
    aLeft_local._4_4_ = (uint)(cVar3 == 0);
  }
  return aLeft_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::StrictEqualEmptyString(Var aLeft)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_StrictEqualEmptyString);
        JavascriptString * string = JavascriptOperators::TryFromVar<JavascriptString>(aLeft);
        if (!string)
        {
            return false;
        }

        Assert(string);
        return string->GetLength() == 0;
        JIT_HELPER_END(Op_StrictEqualEmptyString);
    }